

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revsurface.hpp
# Opt level: O2

vec3f __thiscall RevSurface::surface(RevSurface *this,float u,float v,vec3f *dpdu,vec3f *dpdv)

{
  float fVar1;
  vec3f vVar2;
  vec4f vVar3;
  vec4f vVar4;
  pair<vec3f,_vec3f> pnd;
  float local_c8;
  vec4f local_a0;
  vec3f local_8c;
  undefined1 local_80 [20];
  float local_6c;
  mat4f local_68;
  
  (**this->curve->_vptr_Curve)(SUB84((double)u,0),local_80);
  dpdu->z = local_6c;
  dpdu->x = (float)local_80._12_4_;
  dpdu->y = (float)local_80._16_4_;
  fVar1 = cosf(PI * v * -2.0);
  local_68.data[2][0] = sinf(v * -2.0 * PI);
  local_68.data[0][1] = 0.0;
  local_68.data[0][2] = -local_68.data[2][0];
  local_68.data[0][3] = 0.0;
  local_68.data[1][0] = 0.0;
  local_68.data[1][1] = 1.0;
  local_68.data[1][2] = 0.0;
  local_68.data[1][3] = 0.0;
  local_68.data[2][1] = 0.0;
  local_68.data[2][3] = 0.0;
  local_68.data[3][0] = 0.0;
  local_68.data[3][1] = 0.0;
  local_68.data[3][2] = 0.0;
  local_68.data[3][3] = 1.0;
  local_a0.x = (float)local_80._0_4_;
  local_a0.y = (float)local_80._4_4_;
  local_a0.z = (float)local_80._8_4_;
  local_a0.w = 1.0;
  local_68.data[0][0] = fVar1;
  local_68.data[2][2] = fVar1;
  vVar3 = operator*(&local_68,&local_a0);
  local_a0.x = dpdu->x;
  local_a0.y = dpdu->y;
  local_a0.z = dpdu->z;
  local_a0.w = 1.0;
  vVar4 = operator*(&local_68,&local_a0);
  dpdu->x = (float)(int)vVar4._0_8_;
  dpdu->y = (float)(int)((ulong)vVar4._0_8_ >> 0x20);
  dpdu->z = vVar4.z;
  local_a0._0_8_ = vVar3._0_8_ & 0xffffffff;
  local_c8 = vVar3.z;
  local_a0.z = local_c8;
  local_8c.y = PI * -2.0;
  local_8c.x = 0.0;
  local_8c.z = 0.0;
  vVar2 = cross((vec3f *)&local_a0,&local_8c);
  dpdv->x = (float)(int)vVar2._0_8_;
  dpdv->y = (float)(int)((ulong)vVar2._0_8_ >> 0x20);
  dpdv->z = vVar2.z;
  return vVar3._0_12_;
}

Assistant:

vec3f surface(float u, float v, vec3f& dpdu, vec3f& dpdv) const
	{
		vec3f p;
		auto pnd = curve->atParam(u);
		p = pnd.first;
		dpdu = pnd.second;
		// rotate around Y axis
	    float c = std::cos(-v*2*PI);
	    float s = std::sin(-v*2*PI);
		auto rot = mat4f(
	        c,  0, -s,  0,
	        0,  1,  0,  0,
	        s,  0,  c,  0,
	        0,  0,  0,  1
	    );
	    p = (rot * vec4f(p, 1)).xyz();
	    dpdu = (rot * vec4f(dpdu, 1)).xyz();
	    dpdv = cross(vec3f(p.x,0,p.z), vec3f(0,-2*PI,0));
	    return p;
	}